

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view,std::basic_string_view<char,std::char_traits<char>>>
                   (string *__return_storage_ptr__,static_string_view *a,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b,
                   static_string_view *args,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                   static_string_view *args_2,
                   basic_string_view<char,_std::char_traits<char>_> *args_3)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_210;
  cmAlphaNum local_1d8;
  cmAlphaNum local_1a0;
  cmAlphaNum local_168;
  cmAlphaNum local_130;
  cmAlphaNum local_f8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_c0;
  string_view local_a8;
  string *local_98;
  string_view local_90;
  string *local_80;
  string_view local_78;
  string *local_68;
  string_view local_60;
  string *local_50;
  string_view local_48;
  string *local_38;
  
  local_f8.View_._M_len = (a->super_string_view)._M_len;
  local_f8.View_._M_str = (a->super_string_view)._M_str;
  local_f8.RValueString_ = (string *)0x0;
  local_c0.first = cmAlphaNum::View(&local_f8);
  local_c0.second = local_f8.RValueString_;
  local_130.RValueString_ = (string *)0x0;
  local_130.View_._M_str = (b->_M_dataplus)._M_p;
  local_130.View_._M_len = b->_M_string_length;
  local_a8 = cmAlphaNum::View(&local_130);
  local_98 = local_130.RValueString_;
  local_168.View_._M_len = (args->super_string_view)._M_len;
  local_168.View_._M_str = (args->super_string_view)._M_str;
  local_168.RValueString_ = (string *)0x0;
  local_90 = cmAlphaNum::View(&local_168);
  local_80 = local_168.RValueString_;
  local_1a0.RValueString_ = (string *)0x0;
  local_1a0.View_._M_str = (args_1->_M_dataplus)._M_p;
  local_1a0.View_._M_len = args_1->_M_string_length;
  local_78 = cmAlphaNum::View(&local_1a0);
  local_68 = local_1a0.RValueString_;
  local_1d8.View_._M_len = (args_2->super_string_view)._M_len;
  local_1d8.View_._M_str = (args_2->super_string_view)._M_str;
  local_1d8.RValueString_ = (string *)0x0;
  local_60 = cmAlphaNum::View(&local_1d8);
  local_50 = local_1d8.RValueString_;
  local_210.View_._M_len = args_3->_M_len;
  local_210.View_._M_str = args_3->_M_str;
  local_210.RValueString_ = (string *)0x0;
  local_48 = cmAlphaNum::View(&local_210);
  local_38 = local_210.RValueString_;
  views._M_len = 6;
  views._M_array = &local_c0;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}